

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,CheckerInstantiationSyntax *syntax,
               ASTContext *parentContext,SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  pointer ppSVar1;
  size_type sVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  NetType *netType;
  HierarchicalInstanceSyntax *instance;
  UninstantiatedDefSymbol *this;
  long lVar3;
  string_view sVar4;
  iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> local_1b8;
  ulong local_1a8;
  Compilation *local_1a0;
  char *local_198;
  size_t local_190;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_188;
  UninstantiatedDefSymbol *local_180;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_168;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_158;
  Token local_140;
  ASTContext context;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  
  local_1a0 = compilation;
  local_188 = implicitNets;
  ASTContext::resetFlags(&context,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  local_140 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(syntax->type).ptr);
  sVar4 = parsing::Token::valueText(&local_140);
  local_198 = sVar4._M_str;
  local_190 = sVar4._M_len;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet(&implicitNetNames);
  netType = Scope::getDefaultNetType(context.scope.ptr);
  local_1b8.index = 0;
  local_1a8 = (syntax->instances).elements._M_extent._M_extent_value + 1 >> 1;
  local_1b8.list = &syntax->instances;
  for (; (local_1b8.list != &syntax->instances || (local_1b8.index != local_1a8));
      local_1b8.index = local_1b8.index + 1) {
    instance = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
               iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>::dereference
                         (&local_1b8);
    local_168._M_ptr = (pointer)0x0;
    local_168._M_extent._M_extent_value = 0;
    local_178._M_len = local_190;
    local_178._M_str = local_198;
    anon_unknown.dwarf_beab97::createImplicitNets
              (instance,&context,netType,(bitmask<slang::ast::InstanceFlags>)0x0,&implicitNetNames,
               local_188);
    anon_unknown.dwarf_beab97::getNameLoc(&local_158,instance);
    this = BumpAllocator::
           emplace<slang::ast::UninstantiatedDefSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::basic_string_view<char,std::char_traits<char>>&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                     (&local_1a0->super_BumpAllocator,&local_158.first,&local_158.second,&local_178,
                      &local_168);
    (this->super_Symbol).originatingSyntax = &instance->super_SyntaxNode;
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&this->super_Symbol,context.scope.ptr,syntax_00);
    local_180 = this;
    SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*>
              ((SmallVectorBase<slang::ast::Symbol_const*> *)results,(Symbol **)&local_180);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                 *)&implicitNetNames.super_Storage.field_0x88);
  ppSVar1 = results->data_;
  sVar2 = results->len;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    *(undefined1 *)(*(long *)((long)ppSVar1 + lVar3) + 0x88) = 1;
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const CheckerInstantiationSyntax& syntax,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    createUninstantiatedDefs(compilation, syntax, syntax.type->getLastToken().valueText(), context,
                             {}, results, implicitNets);

    for (auto sym : results)
        sym->as<UninstantiatedDefSymbol>().mustBeChecker = true;
}